

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

monst * boomhit(int dx,int dy)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  schar sVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  monst *mtmp;
  bool bVar13;
  
  bhitpos = (coord)u._0_2_;
  uVar10 = 8;
  for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
    if ((xdir[uVar6] == dx) && (""[uVar6] == dy)) {
      uVar10 = uVar6 & 0xffffffff;
      break;
    }
  }
  tmp_at(-2,0x40003);
  uVar8 = 2;
  iVar12 = 10;
  uVar11 = 0;
  do {
    bVar13 = iVar12 == 0;
    iVar12 = iVar12 + -1;
    if (bVar13) {
LAB_002822be:
      mtmp = (monst *)0x0;
LAB_002822c4:
      tmp_at(-6,0);
      return mtmp;
    }
    iVar9 = (int)uVar10;
    if (iVar9 == 8) {
      iVar9 = 0;
    }
    tmp_at(-5,(uVar8 == 2) + 0x40003);
    cVar1 = xdir[iVar9];
    cVar2 = ""[iVar9];
    cVar7 = bhitpos.x + cVar1;
    bhitpos.y = bhitpos.y + cVar2;
    bhitpos.x = cVar7;
    mtmp = level->monsters[cVar7][bhitpos.y];
    if ((mtmp != (monst *)0x0) && ((mtmp->field_0x61 & 2) == 0)) {
      m_respond(mtmp);
      goto LAB_002822c4;
    }
    if (level->locations[cVar7][bhitpos.y].typ < '\x11') {
LAB_00282242:
      bhitpos.y = bhitpos.y - cVar2;
      bhitpos.x = cVar7 - cVar1;
      goto LAB_002822be;
    }
    bVar3 = closed_door(level,(int)cVar7,(int)bhitpos.y);
    cVar7 = bhitpos.x;
    if (bVar3 != '\0') goto LAB_00282242;
    if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
      if (u.uprops[0x25].extrinsic == 0 && u.uprops[0x25].intrinsic == 0) {
        uVar8 = mt_random();
        sVar4 = acurr(3);
        if ((int)(uVar8 % 0x14) < (int)sVar4) {
          tmp_at(-6,0);
          pline("You skillfully catch the boomerang.");
          return &youmonst;
        }
      }
      iVar12 = rnd(10);
      thitu(10,iVar12,(obj *)0x0,(obj *)0x0,(monst *)0x0,"boomerang");
      goto LAB_002822be;
    }
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    (*windowprocs.win_delay)();
    if (level->locations[bhitpos.x][bhitpos.y].typ == '\x1f') goto LAB_002822be;
    uVar8 = uVar8 == 2 | 2;
    uVar5 = uVar11 - 5;
    if (uVar11 < 5) {
      uVar5 = uVar11;
    }
    uVar10 = (ulong)((iVar9 + 1) - (uint)(uVar5 == 0));
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

struct monst *boomhit(int dx, int dy)
{
	int i, ct;
	int boom = E_boomleft;	/* showsym[] index  */
	struct monst *mtmp;

	bhitpos.x = u.ux;
	bhitpos.y = u.uy;

	for (i = 0; i < 8; i++) if (xdir[i] == dx && ydir[i] == dy) break;
	tmp_at(DISP_FLASH, dbuf_effect(E_MISC, boom));
	for (ct = 0; ct < 10; ct++) {
		if (i == 8) i = 0;
		boom = (boom == E_boomleft) ? E_boomright : E_boomleft;
		tmp_at(DISP_CHANGE, dbuf_effect(E_MISC, boom));/* change glyph */
		dx = xdir[i];
		dy = ydir[i];
		bhitpos.x += dx;
		bhitpos.y += dy;
		if (MON_AT(level, bhitpos.x, bhitpos.y)) {
			mtmp = m_at(level, bhitpos.x,bhitpos.y);
			m_respond(mtmp);
			tmp_at(DISP_END, 0);
			return mtmp;
		}
		if (!ZAP_POS(level->locations[bhitpos.x][bhitpos.y].typ) ||
		   closed_door(level, bhitpos.x, bhitpos.y)) {
			bhitpos.x -= dx;
			bhitpos.y -= dy;
			break;
		}
		if (bhitpos.x == u.ux && bhitpos.y == u.uy) { /* ct == 9 */
			if (Fumbling || rn2(20) >= ACURR(A_DEX)) {
				/* We hit ourselves, but don't credit it like that;
				 * a boomerang with properties will eventually
				 * land in artifact_hit(), which can't handle
				 * self-hits. */
				thitu(10, rnd(10), NULL, NULL, NULL,
					"boomerang");
				break;
			} else {	/* we catch it */
				tmp_at(DISP_END, 0);
				pline("You skillfully catch the boomerang.");
				return &youmonst;
			}
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		if (ct % 5 != 0) i++;
		if (IS_SINK(level->locations[bhitpos.x][bhitpos.y].typ))
			break;	/* boomerang falls on sink */
	}
	tmp_at(DISP_END, 0);	/* do not leave last symbol */
	return NULL;
}